

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPErr(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *str1,
                  xmlChar *str2)

{
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    channel = (xmlGenericErrorFunc)0x0;
    schannel = (xmlStructuredErrorFunc)0x0;
    data = (void *)0x0;
  }
  else {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = error;
    data = ctxt->errCtxt;
    channel = ctxt->error;
    schannel = ctxt->serror;
  }
  __xmlRaiseError(schannel,channel,data,ctxt,node,0x10,error,XML_ERR_ERROR,(char *)0x0,0,
                  (char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1,str2);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlSchemaPErr(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int error,
              const char *msg, const xmlChar * str1, const xmlChar * str2)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        ctxt->nberrors++;
	ctxt->err = error;
        channel = ctxt->error;
        data = ctxt->errCtxt;
	schannel = ctxt->serror;
    }